

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

BlockEntry * __thiscall mkvparser::Cluster::GetEntry(Cluster *this,Track *pTrack,longlong time_ns)

{
  int iVar1;
  BlockEntry **ppBVar2;
  Block *this_00;
  long lVar3;
  long lVar4;
  BlockEntry *pBVar5;
  BlockEntry *pBVar6;
  BlockEntry *pBVar7;
  long len;
  longlong pos;
  long local_40;
  longlong local_38;
  undefined4 extraout_var;
  
  if (pTrack == (Track *)0x0) {
    __assert_fail("pTrack",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cfd,
                  "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const");
  }
  if (this->m_pSegment == (Segment *)0x0) {
    return &(pTrack->m_eos).super_BlockEntry;
  }
  lVar4 = 0;
  pBVar7 = &(pTrack->m_eos).super_BlockEntry;
  do {
    if (lVar4 < this->m_entries_count) {
      ppBVar2 = this->m_entries;
    }
    else {
      lVar3 = Parse(this,&local_38,&local_40);
      if (lVar3 < 0) {
        __assert_fail("status >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d0c,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                     );
      }
      if (lVar3 != 0) {
        return pBVar7;
      }
      ppBVar2 = this->m_entries;
      if (ppBVar2 == (BlockEntry **)0x0) {
        __assert_fail("m_entries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d14,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                     );
      }
      if (this->m_entries_count <= lVar4) {
        __assert_fail("index < m_entries_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d15,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                     );
      }
    }
    pBVar5 = ppBVar2[lVar4];
    if (pBVar5 == (BlockEntry *)0x0) {
      __assert_fail("pEntry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d19,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                   );
    }
    iVar1 = (*pBVar5->_vptr_BlockEntry[3])(pBVar5);
    if (iVar1 == 0) {
      __assert_fail("!pEntry->EOS()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d1a,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                   );
    }
    iVar1 = (*pBVar5->_vptr_BlockEntry[2])(pBVar5);
    this_00 = (Block *)CONCAT44(extraout_var,iVar1);
    if (this_00 == (Block *)0x0) {
      __assert_fail("pBlock",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d1d,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                   );
    }
    pBVar6 = pBVar7;
    if (this_00->m_track == (pTrack->m_info).number) {
      iVar1 = (*pTrack->_vptr_Track[2])(pTrack,pBVar5);
      if ((char)iVar1 == '\0') {
        if (time_ns < 0) goto LAB_0012be92;
        lVar3 = Block::GetTime(this_00,this);
        pBVar5 = pBVar7;
      }
      else {
        if (time_ns < 0) {
          return pBVar5;
        }
        lVar3 = Block::GetTime(this_00,this);
      }
      pBVar6 = pBVar5;
      if (time_ns < lVar3) {
        return pBVar7;
      }
    }
LAB_0012be92:
    lVar4 = lVar4 + 1;
    pBVar7 = pBVar6;
  } while( true );
}

Assistant:

const BlockEntry* Cluster::GetEntry(const Track* pTrack,
                                    long long time_ns) const {
  assert(pTrack);

  if (m_pSegment == NULL)  // this is the special EOS cluster
    return pTrack->GetEOS();

  const BlockEntry* pResult = pTrack->GetEOS();

  long index = 0;

  for (;;) {
    if (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);
      assert(status >= 0);

      if (status > 0)  // completely parsed, and no more entries
        return pResult;

      if (status < 0)  // should never happen
        return 0;

      assert(m_entries);
      assert(index < m_entries_count);
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if (pBlock->GetTrackNumber() != pTrack->GetNumber()) {
      ++index;
      continue;
    }

    if (pTrack->VetEntry(pEntry)) {
      if (time_ns < 0)  // just want first candidate block
        return pEntry;

      const long long ns = pBlock->GetTime(this);

      if (ns > time_ns)
        return pResult;

      pResult = pEntry;  // have a candidate
    } else if (time_ns >= 0) {
      const long long ns = pBlock->GetTime(this);

      if (ns > time_ns)
        return pResult;
    }

    ++index;
  }
}